

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O2

void __thiscall llvm::Triple::setObjectFormat(Triple *this,ObjectFormatType Kind)

{
  StringRef Str;
  StringRef local_e0;
  StringRef local_d0;
  Twine local_c0;
  Twine local_a8;
  Twine local_90;
  Twine local_78;
  Twine local_60;
  StringRef local_48;
  
  if (this->Environment != UnknownEnvironment) {
    local_d0 = getEnvironmentTypeName(this->Environment);
    Twine::Twine(&local_90,&local_d0);
    Twine::Twine(&local_a8,"-");
    Twine::concat(&local_78,&local_90,&local_a8);
    local_e0 = getObjectFormatTypeName(Kind);
    Twine::Twine(&local_c0,&local_e0);
    Twine::concat(&local_60,&local_78,&local_c0);
    Twine::str_abi_cxx11_((string *)&local_48,&local_60);
    setEnvironmentName(this,local_48);
    std::__cxx11::string::_M_dispose();
    return;
  }
  Str = getObjectFormatTypeName(Kind);
  setEnvironmentName(this,Str);
  return;
}

Assistant:

void Triple::setObjectFormat(ObjectFormatType Kind) {
  if (Environment == UnknownEnvironment)
    return setEnvironmentName(getObjectFormatTypeName(Kind));

  setEnvironmentName((getEnvironmentTypeName(Environment) + Twine("-") +
                      getObjectFormatTypeName(Kind)).str());
}